

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::PopulateTcParseLookupTable
               (TailCallTableInfo *table_info,uint16_t *lookup_table)

{
  SkipEntry16 SVar1;
  _Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  *p_Var2;
  bool bVar3;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  *this;
  reference pSVar4;
  size_type sVar5;
  reference pSVar6;
  uint16_t local_54;
  uint16_t uStack_52;
  const_iterator cStack_50;
  SkipEntry16 se16;
  const_iterator __end3;
  const_iterator __begin3;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
  *__range3;
  SkipEntryBlock *entry_block;
  const_iterator __end2;
  const_iterator __begin2;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  *__range2;
  uint16_t *lookup_table_local;
  TailCallTableInfo *table_info_local;
  
  this = &(table_info->num_to_entry_table).blocks;
  __end2 = std::
           vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ::begin(this);
  entry_block = (SkipEntryBlock *)
                std::
                vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                ::end(this);
  __range2 = (vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
              *)lookup_table;
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::internal::TailCallTableInfo::SkipEntryBlock_*,_std::vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>_>
                                *)&entry_block);
    if (!bVar3) break;
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::SkipEntryBlock_*,_std::vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>_>
             ::operator*(&__end2);
    *(short *)&(__range2->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               )._M_impl.super__Vector_impl_data._M_start = (short)pSVar4->first_fnum;
    p_Var2 = &__range2->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ;
    *(short *)((long)&(__range2->
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                      )._M_impl.super__Vector_impl_data._M_start + 2) =
         (short)(pSVar4->first_fnum >> 0x10);
    sVar5 = std::
            vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
            ::size(&pSVar4->entries);
    __range2 = (vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                *)((long)&(__range2->
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                          )._M_impl.super__Vector_impl_data._M_start + 6);
    *(short *)((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + 4) = (short)sVar5;
    __end3 = std::
             vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
             ::begin(&pSVar4->entries);
    cStack_50 = std::
                vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                ::end(&pSVar4->entries);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffb0);
      if (!bVar3) break;
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::SkipEntry16_*,_std::vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>_>
               ::operator*(&__end3);
      SVar1 = *pSVar6;
      local_54 = SVar1.skipmap;
      p_Var2 = &__range2->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
      ;
      *(uint16_t *)
       &(__range2->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        )._M_impl.super__Vector_impl_data._M_start = local_54;
      uStack_52 = SVar1.field_entry_offset;
      __range2 = (vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                  *)((long)&(__range2->
                            super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                            )._M_impl.super__Vector_impl_data._M_start + 4);
      *(uint16_t *)((long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + 2) = uStack_52;
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::SkipEntry16_*,_std::vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::SkipEntryBlock_*,_std::vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>_>
    ::operator++(&__end2);
  }
  *(undefined2 *)
   &(__range2->
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    )._M_impl.super__Vector_impl_data._M_start = 0xffff;
  *(undefined2 *)
   ((long)&(__range2->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           )._M_impl.super__Vector_impl_data._M_start + 2) = 0xffff;
  return;
}

Assistant:

static void PopulateTcParseLookupTable(
    const internal::TailCallTableInfo& table_info, uint16_t* lookup_table) {
  for (const auto& entry_block : table_info.num_to_entry_table.blocks) {
    *lookup_table++ = entry_block.first_fnum & 0xFFFF;
    *lookup_table++ = entry_block.first_fnum >> 16;
    *lookup_table++ = entry_block.entries.size();
    for (auto se16 : entry_block.entries) {
      *lookup_table++ = se16.skipmap;
      *lookup_table++ = se16.field_entry_offset;
    }
  }
  *lookup_table++ = 0xFFFF;
  *lookup_table++ = 0xFFFF;
}